

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

bool __thiscall
QXmlStreamReaderPrivate::scanUntil(QXmlStreamReaderPrivate *this,char *str,short tokenToInject)

{
  QString *this_00;
  qsizetype from;
  qint64 qVar1;
  bool bVar2;
  uint uVar3;
  QChar ch;
  long in_FS_OFFSET;
  QStringView s;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->textBuffer;
  from = (this->textBuffer).d.size;
  qVar1 = this->lineNumber;
  do {
    do {
      while( true ) {
        uVar3 = getChar(this);
        if (uVar3 != 9) break;
        ch.ucs = L'\t';
LAB_003523ee:
        QString::append(this_00,ch);
      }
      if (uVar3 == 10) {
LAB_003523d2:
        ch.ucs = (char16_t)uVar3;
        this->lineNumber = this->lineNumber + 1;
        this->lastLineStart = this->readBufferPos + this->characterOffset;
        goto LAB_003523ee;
      }
      if (uVar3 != 0xd) {
        if (uVar3 == 0xffffffff) {
          s.m_data = (this->textBuffer).d.ptr;
          s.m_size = (this->textBuffer).d.size;
          putString(this,s,from);
          QString::resize(this_00,from);
        }
        else {
          if (((0x1f < uVar3) && (uVar3 < 0x110000)) && ((uVar3 & 0xfffffffe) != 0xfffe)) {
            QString::append(this_00,(QChar)(char16_t)uVar3);
            goto LAB_003523ff;
          }
          QXmlStream::tr((QString *)&local_50,"Invalid XML character.",(char *)0x0,-1);
          raiseWellFormedError(this,(QString *)&local_50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        }
        this->lineNumber = qVar1;
        bVar2 = false;
        goto LAB_0035249b;
      }
      uVar3 = filterCarriageReturn(this);
      if (uVar3 != 0) goto LAB_003523d2;
      uVar3 = 0;
LAB_003523ff:
    } while (uVar3 != (int)*str);
    if (str[1] == '\0') {
      bVar2 = true;
      if (-1 < tokenToInject) {
        injectToken(this,tokenToInject);
      }
      goto LAB_0035249b;
    }
    bVar2 = scanString(this,str + 1,tokenToInject,false);
  } while (!bVar2);
  bVar2 = true;
LAB_0035249b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QXmlStreamReaderPrivate::scanUntil(const char *str, short tokenToInject)
{
    const qsizetype pos = textBuffer.size();
    const auto oldLineNumber = lineNumber;

    uint c;
    while ((c = getChar()) != StreamEOF) {
        /* First, we do the validation & normalization. */
        switch (c) {
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                break;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case '\t':
            textBuffer += QChar(c);
            continue;
        default:
            if (c < 0x20 || (c > 0xFFFD && c < 0x10000) || c > QChar::LastValidCodePoint ) {
                raiseWellFormedError(QXmlStream::tr("Invalid XML character."));
                lineNumber = oldLineNumber;
                return false;
            }
            textBuffer += QChar(c);
        }


        /* Second, attempt to lookup str. */
        if (c == uint(*str)) {
            if (!*(str + 1)) {
                if (tokenToInject >= 0)
                    injectToken(tokenToInject);
                return true;
            } else {
                if (scanString(str + 1, tokenToInject, false))
                    return true;
            }
        }
    }
    putString(textBuffer, pos);
    textBuffer.resize(pos);
    lineNumber = oldLineNumber;
    return false;
}